

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

index_pointer __thiscall
pstore::index::
hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
::insert_into_leaf<std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
          (hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
           *this,transaction_base *transaction,index_pointer *existing_leaf,
          pair<pstore::indirect_string,_pstore::index::details::empty_class> *new_leaf,
          hash_type existing_hash,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  bool bVar1;
  uint uVar2;
  ulong new_hash_00;
  pointer pcVar3;
  internal_node *piVar4;
  pointer p;
  array_stack<pstore::index::details::parent_type,_13UL> *paVar5;
  parent_type local_e8;
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *local_d8;
  value_type local_d0;
  address local_c8;
  undefined1 local_c0 [32];
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *local_a0;
  index_pointer local_98;
  index_pointer leaf_ptr;
  parent_type local_88;
  value_type local_78;
  index_pointer local_70;
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *local_68;
  address local_60;
  address leaf_addr;
  hash_type old_hash;
  hash_type new_hash;
  hash_type hash_local;
  hash_type existing_hash_local;
  pair<pstore::indirect_string,_pstore::index::details::empty_class> *new_leaf_local;
  index_pointer *existing_leaf_local;
  transaction_base *transaction_local;
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *this_local;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents_local;
  index_pointer linear_ptr;
  
  this_local = (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                *)parents.ptr_;
  bVar1 = details::depth_is_internal_node(shifts);
  if (bVar1) {
    new_hash_00 = hash & 0x3f;
    leaf_addr.a_ = existing_hash & 0x3f;
    if (new_hash_00 == leaf_addr.a_) {
      local_a0 = this_local;
      local_98 = insert_into_leaf<std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
                           (this,transaction,existing_leaf,new_leaf,existing_hash >> 6,hash >> 6,
                            shifts + 6,
                            (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                             )this_local);
      pcVar3 = std::
               unique_ptr<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
               ::get((unique_ptr<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
                      *)(this + 8));
      piVar4 = details::internal_node::
               allocate<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                         (pcVar3,&local_98,leaf_addr.a_);
      details::index_pointer::index_pointer((index_pointer *)&parents_local,piVar4);
      paVar5 = gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
               operator->((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                           *)&this_local);
      local_c0._8_8_ = parents_local.ptr_;
      details::parent_type::parent_type
                ((parent_type *)(local_c0 + 0x10),(index_pointer)parents_local.ptr_,0);
      array_stack<pstore::index::details::parent_type,_13UL>::push
                (paVar5,(value_type *)(local_c0 + 0x10));
    }
    else {
      local_68 = this_local;
      local_60 = store_leaf_node<std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
                           (this,transaction,new_leaf,
                            (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                             )this_local);
      pcVar3 = std::
               unique_ptr<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
               ::get((unique_ptr<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
                      *)(this + 8));
      local_78 = local_60.a_;
      details::index_pointer::index_pointer((index_pointer *)&local_70.addr_,local_60);
      piVar4 = details::internal_node::
               allocate<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                         (pcVar3,existing_leaf,&local_70,leaf_addr.a_,new_hash_00);
      details::index_pointer::index_pointer((index_pointer *)&parents_local,piVar4);
      paVar5 = gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
               operator->((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                           *)&this_local);
      leaf_ptr.addr_.a_ = (address)(address)parents_local.ptr_;
      uVar2 = details::internal_node::get_new_index(new_hash_00,leaf_addr.a_);
      details::parent_type::parent_type(&local_88,leaf_ptr,(ulong)uVar2);
      array_stack<pstore::index::details::parent_type,_13UL>::push(paVar5,&local_88);
    }
  }
  else {
    local_c8 = details::index_pointer::to_address((index_pointer *)&existing_leaf->addr_);
    local_d8 = this_local;
    local_d0 = (value_type)
               store_leaf_node<std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
                         (this,transaction,new_leaf,
                          (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                           )this_local);
    details::linear_node::allocate((linear_node *)local_c0,local_c8,(address)local_d0);
    p = std::
        unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
        ::release((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                   *)local_c0);
    details::index_pointer::index_pointer((index_pointer *)&parents_local,p);
    std::
    unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
    ::~unique_ptr((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                   *)local_c0);
    paVar5 = gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
             operator->((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                         *)&this_local);
    details::parent_type::parent_type(&local_e8,(index_pointer)parents_local.ptr_,1);
    array_stack<pstore::index::details::parent_type,_13UL>::push(paVar5,&local_e8);
  }
  return (index_pointer)(address)parents_local.ptr_;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_into_leaf (
            transaction_base & transaction, index_pointer const & existing_leaf,
            OtherValueType const & new_leaf, hash_type existing_hash, hash_type hash,
            unsigned shifts, gsl::not_null<parent_stack *> parents) -> index_pointer {

            if (details::depth_is_internal_node (shifts)) {
                auto const new_hash = hash & details::hash_index_mask;
                auto const old_hash = existing_hash & details::hash_index_mask;
                if (new_hash != old_hash) {
                    address const leaf_addr =
                        this->store_leaf_node (transaction, new_leaf, parents);
                    auto const internal_ptr = index_pointer{
                        internal_node::allocate (internals_container_.get (), existing_leaf,
                                                 index_pointer{leaf_addr}, old_hash, new_hash)};
                    parents->push (details::parent_type{
                        internal_ptr, internal_node::get_new_index (new_hash, old_hash)});
                    return internal_ptr;
                }

                // We've found a (partial) hash collision. Replace this leaf node with an internal
                // node. The existing key must be replaced with a sub-hash table and the next 6 bit
                // hash of the existing key computed. If there's still a collision, we repeat the
                // process. The new and existing keys are then inserted in the new sub-hash table.
                // As long as the partial hashes match, we have to create single element internal
                // nodes to represent them. This should happen very rarely with a reasonably good
                // hash function.

                shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
                existing_hash >>= details::hash_index_bits;

                index_pointer const leaf_ptr = this->insert_into_leaf (
                    transaction, existing_leaf, new_leaf, existing_hash, hash, shifts, parents);
                auto const internal_ptr = index_pointer{
                    internal_node::allocate (internals_container_.get (), leaf_ptr, old_hash)};
                parents->push (details::parent_type{internal_ptr, 0U});
                return internal_ptr;
            }

            // We ran out of hash bits: create a new linear node.
            auto const linear_ptr = index_pointer{
                linear_node::allocate (existing_leaf.to_address (),
                                       this->store_leaf_node (transaction, new_leaf, parents))
                    .release ()};
            parents->push (details::parent_type{linear_ptr, 1U});
            return linear_ptr;
        }